

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cxx
# Opt level: O1

void __thiscall uint32_array_digest_test::test_method(uint32_array_digest_test *this)

{
  int iVar1;
  digest_type hash;
  char *local_120;
  string *local_118;
  undefined1 local_110 [8];
  undefined8 local_108;
  shared_count sStack_100;
  string str;
  type array;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined **local_90;
  undefined1 local_88;
  undefined8 *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char **local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  string **local_38;
  
  array._M_elems[0] = 0;
  array._M_elems[1] = 0x11111111;
  array._M_elems[2] = 0x22222222;
  array._M_elems[3] = 0x33333333;
  hash._M_elems =
       (_Type)cryptox::
              digest<cryptox::message_digest_algorithm<&EVP_md5,128ul>,std::array<unsigned_int,4ul>>
                        (&array);
  cryptox::to_hex<unsigned_char_const*>
            (&str,(cryptox *)&hash,(uchar *)&local_120,(uchar *)&local_120);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_a8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x3d);
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_002e3d40;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  iVar1 = std::__cxx11::string::compare((char *)&str);
  local_110[0] = iVar1 == 0;
  local_108 = 0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_98 = "";
  local_38 = &local_118;
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_002e3db8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_58 = &local_120;
  local_120 = "89dfed81253840a81164dee0ed6be878";
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_002e4288;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_118 = &str;
  boost::test_tools::tt_detail::report_assertion
            (local_110,&local_90,&local_a0,0x3d,1,2,2,"str",&local_50,
             "\"89dfed81253840a81164dee0ed6be878\"",&local_70);
  boost::detail::shared_count::~shared_count(&sStack_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(uint32_array_digest_test) {
	const cryptox::array<std::uint32_t, 4>::type array = {
		0x00000000, 0x11111111,
		0x22222222, 0x33333333
	};

	const md5::digest_type hash = digest<md5>(array);
	const std::string str = to_hex(hash);
	BOOST_CHECK_EQUAL(str, "89dfed81253840a81164dee0ed6be878");
}